

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# step.cpp
# Opt level: O2

step * make_empty_step(uint *wastage,bucket *b)

{
  step *in_RDI;
  
  in_RDI->step_action = empty;
  in_RDI->bucket1 = b;
  in_RDI->bucket2 = (bucket *)0x0;
  in_RDI->wastage = wastage;
  in_RDI->bucket1_used_before = 0;
  in_RDI->bucket2_used_before = 0;
  in_RDI->bucket1_used_after = 0;
  in_RDI->bucket2_used_after = 0;
  in_RDI->difference = 0;
  return in_RDI;
}

Assistant:

step make_empty_step(unsigned& wastage, bucket* b)
{
	return step{action::empty, &wastage, b};
}